

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EdgeDescriptorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeDescriptorSyntax,slang::syntax::EdgeDescriptorSyntax_const&>
          (BumpAllocator *this,EdgeDescriptorSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  EdgeDescriptorSyntax *pEVar13;
  
  pEVar13 = (EdgeDescriptorSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EdgeDescriptorSyntax *)this->endPtr < pEVar13 + 1) {
    pEVar13 = (EdgeDescriptorSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pEVar13 + 1);
  }
  (pEVar13->t2).info = (args->t2).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->t1).kind;
  uVar8 = (args->t1).field_0x2;
  NVar9.raw = (args->t1).numFlags.raw;
  uVar10 = (args->t1).rawLen;
  TVar3 = (args->t2).kind;
  uVar4 = (args->t2).field_0x2;
  NVar5.raw = (args->t2).numFlags.raw;
  uVar6 = (args->t2).rawLen;
  (pEVar13->t1).info = (args->t1).info;
  (pEVar13->t2).kind = TVar3;
  (pEVar13->t2).field_0x2 = uVar4;
  (pEVar13->t2).numFlags = (NumericTokenFlags)NVar5.raw;
  (pEVar13->t2).rawLen = uVar6;
  (pEVar13->super_SyntaxNode).previewNode = pSVar2;
  (pEVar13->t1).kind = TVar7;
  (pEVar13->t1).field_0x2 = uVar8;
  (pEVar13->t1).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar13->t1).rawLen = uVar10;
  (pEVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pEVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pEVar13->super_SyntaxNode).parent = pSVar1;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }